

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.cpp
# Opt level: O3

ExpressionType duckdb::WindowExpression::WindowToExpressionType(string *fun_name)

{
  int iVar1;
  ExpressionType EVar2;
  
  iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
  if (iVar1 == 0) {
    EVar2 = WINDOW_RANK;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
    EVar2 = WINDOW_RANK_DENSE;
    if ((iVar1 != 0) && (iVar1 = ::std::__cxx11::string::compare((char *)fun_name), iVar1 != 0)) {
      iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
      if (iVar1 == 0) {
        EVar2 = WINDOW_PERCENT_RANK;
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
        if (iVar1 == 0) {
          EVar2 = WINDOW_ROW_NUMBER;
        }
        else {
          iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
          EVar2 = WINDOW_FIRST_VALUE;
          if ((iVar1 != 0) &&
             (iVar1 = ::std::__cxx11::string::compare((char *)fun_name), iVar1 != 0)) {
            iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
            EVar2 = WINDOW_LAST_VALUE;
            if ((iVar1 != 0) &&
               (iVar1 = ::std::__cxx11::string::compare((char *)fun_name), iVar1 != 0)) {
              iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
              if (iVar1 == 0) {
                EVar2 = WINDOW_NTH_VALUE;
              }
              else {
                iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
                if (iVar1 == 0) {
                  EVar2 = WINDOW_CUME_DIST;
                }
                else {
                  iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
                  if (iVar1 == 0) {
                    EVar2 = WINDOW_LEAD;
                  }
                  else {
                    iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
                    if (iVar1 == 0) {
                      EVar2 = WINDOW_LAG;
                    }
                    else {
                      iVar1 = ::std::__cxx11::string::compare((char *)fun_name);
                      EVar2 = WINDOW_AGGREGATE;
                      if (iVar1 == 0) {
                        EVar2 = WINDOW_NTILE;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ExpressionType WindowExpression::WindowToExpressionType(string &fun_name) {
	if (fun_name == "rank") {
		return ExpressionType::WINDOW_RANK;
	} else if (fun_name == "rank_dense" || fun_name == "dense_rank") {
		return ExpressionType::WINDOW_RANK_DENSE;
	} else if (fun_name == "percent_rank") {
		return ExpressionType::WINDOW_PERCENT_RANK;
	} else if (fun_name == "row_number") {
		return ExpressionType::WINDOW_ROW_NUMBER;
	} else if (fun_name == "first_value" || fun_name == "first") {
		return ExpressionType::WINDOW_FIRST_VALUE;
	} else if (fun_name == "last_value" || fun_name == "last") {
		return ExpressionType::WINDOW_LAST_VALUE;
	} else if (fun_name == "nth_value") {
		return ExpressionType::WINDOW_NTH_VALUE;
	} else if (fun_name == "cume_dist") {
		return ExpressionType::WINDOW_CUME_DIST;
	} else if (fun_name == "lead") {
		return ExpressionType::WINDOW_LEAD;
	} else if (fun_name == "lag") {
		return ExpressionType::WINDOW_LAG;
	} else if (fun_name == "ntile") {
		return ExpressionType::WINDOW_NTILE;
	}
	return ExpressionType::WINDOW_AGGREGATE;
}